

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

bool __thiscall double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Chunk *pCVar4;
  int in_EDX;
  undefined1 *in_RSI;
  Bignum *in_RDI;
  Chunk most_significant_bigit;
  int j_1;
  Chunk current_bigit;
  int i_1;
  int j;
  int i;
  int string_index;
  int needed_chars;
  uint local_3c;
  int local_38;
  uint local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  bool local_1;
  
  if (in_RDI->used_bigits_ == 0) {
    if (in_EDX < 2) {
      local_1 = false;
    }
    else {
      *in_RSI = 0x30;
      in_RSI[1] = 0;
      local_1 = true;
    }
  }
  else {
    iVar2 = BigitLength(in_RDI);
    pCVar4 = RawBigit(in_RDI,in_RDI->used_bigits_ + -1);
    iVar3 = SizeInHexChars<unsigned_int>(*pCVar4);
    iVar3 = (iVar2 + -1) * 7 + iVar3;
    if (in_EDX < iVar3 + 1) {
      local_1 = false;
    }
    else {
      local_24 = iVar3 + -1;
      in_RSI[iVar3] = 0;
      for (local_28 = 0; local_28 < in_RDI->exponent_; local_28 = local_28 + 1) {
        for (local_2c = 0; local_2c < 7; local_2c = local_2c + 1) {
          in_RSI[local_24] = 0x30;
          local_24 = local_24 + -1;
        }
      }
      for (local_30 = 0; local_30 < in_RDI->used_bigits_ + -1; local_30 = local_30 + 1) {
        pCVar4 = RawBigit(in_RDI,local_30);
        local_34 = *pCVar4;
        for (local_38 = 0; local_38 < 7; local_38 = local_38 + 1) {
          cVar1 = HexCharOfValue(local_34 & 0xf);
          in_RSI[local_24] = cVar1;
          local_34 = local_34 >> 4;
          local_24 = local_24 + -1;
        }
      }
      pCVar4 = RawBigit(in_RDI,in_RDI->used_bigits_ + -1);
      for (local_3c = *pCVar4; local_3c != 0; local_3c = local_3c >> 4) {
        cVar1 = HexCharOfValue(local_3c & 0xf);
        in_RSI[local_24] = cVar1;
        local_24 = local_24 + -1;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Bignum::ToHexString(char* buffer, const int buffer_size) const {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  DOUBLE_CONVERSION_ASSERT(kBigitSize % 4 == 0);
  static const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_bigits_ == 0) {
    if (buffer_size < 2) {
      return false;
    }
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  const int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
    SizeInHexChars(RawBigit(used_bigits_ - 1)) + 1;
  if (needed_chars > buffer_size) {
    return false;
  }
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_bigits_ - 1; ++i) {
    Chunk current_bigit = RawBigit(i);
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = RawBigit(used_bigits_ - 1);
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}